

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.hh
# Opt level: O2

void __thiscall kratos::SequentialStmtBlock::~SequentialStmtBlock(SequentialStmtBlock *this)

{
  ~SequentialStmtBlock(this);
  operator_delete(this,0xf8);
  return;
}

Assistant:

SequentialStmtBlock() : StmtBlock(StatementBlockType::Sequential) {}